

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adsc.c
# Opt level: O0

int la_adsc_nack_parse(void *dest,uint8_t *buf,uint32_t len)

{
  undefined1 *__ptr;
  uint in_EDX;
  undefined1 *in_RSI;
  long in_RDI;
  la_adsc_nack_t *n;
  la_adsc_tag_t *t;
  uint32_t tag_len;
  size_t in_stack_00000030;
  int local_20;
  int local_4;
  
  local_20 = 2;
  if (in_EDX < 2) {
    return -1;
  }
  __ptr = (undefined1 *)la_xcalloc(in_stack_00000030,(size_t)dest,(char *)buf,len,(char *)t);
  *__ptr = *in_RSI;
  if ((byte)in_RSI[1] < 0xe) {
    __ptr[1] = in_RSI[1];
    if (((in_RSI[1] == '\x01') || (in_RSI[1] == '\x02')) || (in_RSI[1] == '\a')) {
      local_20 = 3;
      if (in_EDX < 3) goto LAB_00172ad0;
      __ptr[2] = in_RSI[2];
    }
    *(undefined1 **)(in_RDI + 0x10) = __ptr;
    local_4 = local_20;
  }
  else {
LAB_00172ad0:
    free(__ptr);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

LA_ADSC_PARSER_FUN(la_adsc_nack_parse) {
	uint32_t tag_len = 2;
	la_adsc_tag_t *t = dest;
	LA_ADSC_CHECK_LEN(t->tag, len, tag_len);
	LA_NEW(la_adsc_nack_t, n);

	n->contract_req_num = buf[0];
	if(buf[1] > LA_ADSC_NACK_MAX_REASON_CODE) {
		la_debug_print(D_ERROR, "Invalid reason code: %u\n", buf[1]);
		goto fail;
	}
	n->reason = buf[1];
	la_debug_print(D_INFO, "reason: %u\n", n->reason);

	// these reason codes have extended data byte
	if(buf[1] == 1 || buf[1] == 2 || buf[1] == 7) {
		tag_len++;
		if(len < tag_len) {
			la_debug_print(D_ERROR, "Truncated tag %u: len: %u < %u\n", t->tag, len, tag_len);
			goto fail;
		}
		n->ext_data = buf[2];
		la_debug_print(D_INFO, "ext_data: %u\n", n->ext_data);
	}
	t->data = n;
	return tag_len;
fail:
	LA_XFREE(n);
	return -1;
}